

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseUtils.h
# Opt level: O0

bool Minisat::eagerMatch<Minisat::StreamBuffer>(StreamBuffer *in,char *str)

{
  char cVar1;
  int iVar2;
  char *local_20;
  char *str_local;
  StreamBuffer *in_local;
  
  local_20 = str;
  while( true ) {
    if (*local_20 == '\0') {
      return true;
    }
    cVar1 = *local_20;
    iVar2 = StreamBuffer::operator*(in);
    if (cVar1 != iVar2) break;
    local_20 = local_20 + 1;
    StreamBuffer::operator++(in);
  }
  return false;
}

Assistant:

static bool eagerMatch(B& in, const char* str) {
    for (; *str != '\0'; ++str, ++in)
        if (*str != *in)
            return false;
    return true; }